

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

cf_errno_t cf_file_mkdir(cf_char_t *path)

{
  int iVar1;
  
  if (path != (cf_char_t *)0x0) {
    iVar1 = mkdir(path,0x1ed);
    return (uint)(iVar1 != 0);
  }
  return 2;
}

Assistant:

cf_errno_t  cf_file_mkdir(const cf_char_t* path) {
    if(!path) return CF_EPARAM;
#ifdef CF_OS_WIN
    return _mkdir(path) == 0 ? CF_OK : CF_NOK;
#else
    return mkdir(path, 0755) == 0 ? CF_OK : CF_NOK;
#endif
}